

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

Mat * __thiscall ncnn::ParamDict::get(Mat *__return_storage_ptr__,ParamDict *this,int id,Mat *def)

{
  Mat *local_60;
  Mat *def_local;
  int id_local;
  ParamDict *this_local;
  
  local_60 = def;
  if (this->d->params[id].type != 0) {
    local_60 = &this->d->params[id].v;
  }
  __return_storage_ptr__->data = local_60->data;
  __return_storage_ptr__->refcount = local_60->refcount;
  __return_storage_ptr__->elemsize = local_60->elemsize;
  __return_storage_ptr__->elempack = local_60->elempack;
  __return_storage_ptr__->allocator = local_60->allocator;
  __return_storage_ptr__->dims = local_60->dims;
  __return_storage_ptr__->w = local_60->w;
  __return_storage_ptr__->h = local_60->h;
  __return_storage_ptr__->d = local_60->d;
  __return_storage_ptr__->c = local_60->c;
  __return_storage_ptr__->cstep = local_60->cstep;
  if (__return_storage_ptr__->refcount != (int *)0x0) {
    LOCK();
    *__return_storage_ptr__->refcount = *__return_storage_ptr__->refcount + 1;
    UNLOCK();
  }
  return __return_storage_ptr__;
}

Assistant:

Mat ParamDict::get(int id, const Mat& def) const
{
    return d->params[id].type ? d->params[id].v : def;
}